

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyn_tbl.cpp
# Opt level: O1

longlong dyn_tbl_low_estimate(dyn_tbl_t *dyn_tbl,uchar *key_str)

{
  iterator iVar1;
  mapped_type *pmVar2;
  mapped_type mVar3;
  dyn_tbl_key_t key;
  key_type kStack_28;
  
  mVar3 = 0;
  kStack_28.key[8] = '\0';
  kStack_28.key[9] = '\0';
  kStack_28.key[10] = '\0';
  kStack_28.key[0xb] = '\0';
  kStack_28.key[0xc] = '\0';
  kStack_28.key[0] = '\0';
  kStack_28.key[1] = '\0';
  kStack_28.key[2] = '\0';
  kStack_28.key[3] = '\0';
  kStack_28.key[4] = '\0';
  kStack_28.key[5] = '\0';
  kStack_28.key[6] = '\0';
  kStack_28.key[7] = '\0';
  memcpy(&kStack_28,key_str,(ulong)(dyn_tbl->lgn >> 3));
  iVar1 = std::
          _Hashtable<dyn_tbl_key_s,_std::pair<const_dyn_tbl_key_s,_long_long>,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>,_std::__detail::_Select1st,_dyn_tbl_key_eq,_dyn_tbl_key_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<dyn_tbl_key_s,_std::pair<const_dyn_tbl_key_s,_long_long>,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>,_std::__detail::_Select1st,_dyn_tbl_key_eq,_dyn_tbl_key_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)dyn_tbl,&kStack_28);
  if (iVar1.super__Node_iterator_base<std::pair<const_dyn_tbl_key_s,_long_long>,_true>._M_cur !=
      (__node_type *)0x0) {
    pmVar2 = std::__detail::
             _Map_base<dyn_tbl_key_s,_std::pair<const_dyn_tbl_key_s,_long_long>,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>,_std::__detail::_Select1st,_dyn_tbl_key_eq,_dyn_tbl_key_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<dyn_tbl_key_s,_std::pair<const_dyn_tbl_key_s,_long_long>,_std::allocator<std::pair<const_dyn_tbl_key_s,_long_long>_>,_std::__detail::_Select1st,_dyn_tbl_key_eq,_dyn_tbl_key_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)dyn_tbl,&kStack_28);
    mVar3 = *pmVar2;
  }
  return mVar3;
}

Assistant:

long long dyn_tbl_low_estimate(dyn_tbl_t* dyn_tbl, unsigned char* key_str) {
	dyn_tbl_key_t key;
	memset(key.key, 0, sizeof(key.key));
	memcpy(key.key, key_str, dyn_tbl->lgn / 8);

	if (dyn_tbl->array.find(key) != dyn_tbl->array.end()) {
		return dyn_tbl->array[key];
	}
	else {
		return 0;
	}
}